

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin.c
# Opt level: O2

SchemeObject * RemainderProcedure(SchemeObject *arguments)

{
  char cVar1;
  SchemeObject *pSVar2;
  SchemeObject *pSVar3;
  
  pSVar2 = Car(arguments);
  cVar1 = IsFixnum(pSVar2);
  if (cVar1 != '\0') {
    pSVar2 = Car(arguments);
    pSVar2 = (pSVar2->data).pair.car;
    pSVar3 = Cdr(arguments);
    pSVar3 = Car(pSVar3);
    pSVar2 = MakeFixnum((long)pSVar2 % (long)(pSVar3->data).pair.car);
    return pSVar2;
  }
  fwrite("invalid operation on floating numbers.\n",0x27,1,_stderr);
  exit(1);
}

Assistant:

static SchemeObject*
RemainderProcedure(SchemeObject* arguments) /* (remainder ...) */
{
    if (IsFixnum(Car(arguments))) {
        return MakeFixnum((Car(arguments))->data.fixnum.value %
                          (CADR(arguments))->data.fixnum.value);
    } else {
        fprintf(stderr, "invalid operation on floating numbers.\n");
        exit(1);
    }
}